

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

void toml::detail::
     change_region<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
               (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v,region *reg)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  region_base *__tmp;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001c5720;
  region::region((region *)(p_Var1 + 1),reg);
  (v->region_info_).super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var1 + 1);
  this = (v->region_info_).super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
  (v->region_info_).super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    return;
  }
  return;
}

Assistant:

void change_region(Value& v, region reg)
{
    v.region_info_ = std::make_shared<region>(std::move(reg));
    return;
}